

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall
ikfast::IkSolution<double>::IkSolution
          (IkSolution<double> *this,
          vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
          *vinfos,vector<int,_std::allocator<int>_> *vfree)

{
  (this->super_IkSolutionBase<double>)._vptr_IkSolutionBase =
       (_func_int **)&PTR__IkSolution_00140c80;
  (this->_vbasesol).
  super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_vbasesol).
  super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_vbasesol).
  super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_vfree).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_vfree).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_vfree).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  ::operator=(&this->_vbasesol,vinfos);
  std::vector<int,_std::allocator<int>_>::operator=(&this->_vfree,vfree);
  return;
}

Assistant:

IkSolution(const std::vector<IkSingleDOFSolutionBase<T> >& vinfos, const std::vector<int>& vfree) {
        _vbasesol = vinfos;
        _vfree = vfree;
    }